

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsv.c
# Opt level: O0

void update_status(svdir *s)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *local_f8;
  char *fpidnew;
  char *fpid;
  char *fstatnew;
  char *fstat;
  char *fstatusnew;
  char *fstatus;
  char spid [40];
  undefined1 local_98 [8];
  buffer b;
  char bspace [64];
  char status [20];
  int fd;
  unsigned_long l;
  svdir *s_local;
  
  fstatusnew = "supervise/status";
  fstat = "supervise/status.new";
  fstatnew = "supervise/stat";
  fpid = "supervise/stat.new";
  fpidnew = "supervise/pid";
  local_f8 = "supervise/pid.new";
  if (s->islog != 0) {
    fstatusnew = "log/supervise/status";
    fstat = "log/supervise/status.new";
    fstatnew = "log/supervise/stat";
    fpid = "log/supervise/stat.new";
    fpidnew = "log/supervise/pid";
    local_f8 = "log/supervise/pid.new";
  }
  if (pidchanged != 0) {
    iVar2 = open_trunc(local_f8);
    if (iVar2 == -1) {
      warn2("unable to open ",local_f8);
      return;
    }
    buffer_init((buffer *)local_98,buffer_unixwrite,iVar2,(char *)&b.op,0x40);
    uVar3 = fmt_ulong((char *)&fstatus,(long)s->pid);
    spid[(ulong)uVar3 - 8] = '\0';
    if (s->pid != 0) {
      buffer_puts((buffer *)local_98,(char *)&fstatus);
      buffer_puts((buffer *)local_98,"\n");
      buffer_flush((buffer *)local_98);
    }
    close(iVar2);
    iVar2 = rename(local_f8,fpidnew);
    if (iVar2 == -1) {
      warn2("unable to rename pid.new to ",fpidnew);
      return;
    }
    pidchanged = 0;
  }
  iVar2 = open_trunc(fpid);
  if (iVar2 == -1) {
    warn2("unable to open ",fpid);
  }
  else {
    buffer_init((buffer *)local_98,buffer_unixwrite,iVar2,(char *)&b.op,0x40);
    iVar1 = s->state;
    if (iVar1 == 0) {
      buffer_puts((buffer *)local_98,"down");
    }
    else if (iVar1 == 1) {
      buffer_puts((buffer *)local_98,"run");
    }
    else if (iVar1 == 2) {
      buffer_puts((buffer *)local_98,"finish");
    }
    if ((s->ctrl & 2U) != 0) {
      buffer_puts((buffer *)local_98,", paused");
    }
    if ((s->ctrl & 1U) != 0) {
      buffer_puts((buffer *)local_98,", got TERM");
    }
    if (s->state != 0) {
      if (s->want == 1) {
        buffer_puts((buffer *)local_98,", want down");
      }
      else if (s->want == 2) {
        buffer_puts((buffer *)local_98,", want exit");
      }
    }
    buffer_puts((buffer *)local_98,"\n");
    buffer_flush((buffer *)local_98);
    close(iVar2);
    iVar2 = rename(fpid,fstatnew);
    if (iVar2 == -1) {
      warn2("unable to rename stat.new to ",fstatnew);
    }
    taia_pack(bspace + 0x38,&s->start);
    iVar2 = open_trunc(fstat);
    if (iVar2 == -1) {
      warn2("unable to open ",fstat);
    }
    else {
      uVar4 = write(iVar2,bspace + 0x38,0x14);
      if (uVar4 == 0xffffffffffffffff) {
        warn2("unable to write ",fstat);
        close(iVar2);
        unlink(fstat);
      }
      else {
        close(iVar2);
        if (uVar4 < 0x14) {
          warnx("unable to write ",fstat,": partial write.");
        }
        else {
          iVar2 = rename(fstat,fstatusnew);
          if (iVar2 == -1) {
            warn2("unable to rename status.new to ",fstatusnew);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void update_status(struct svdir *s) {
  unsigned long l;
  int fd;
  char status[20];
  char bspace[64];
  buffer b;
  char spid[FMT_ULONG];
  char *fstatus ="supervise/status";
  char *fstatusnew ="supervise/status.new";
  char *fstat ="supervise/stat";
  char *fstatnew ="supervise/stat.new";
  char *fpid ="supervise/pid";
  char *fpidnew ="supervise/pid.new";

  if (s->islog) {
    fstatus ="log/supervise/status";
    fstatusnew ="log/supervise/status.new";
    fstat ="log/supervise/stat";
    fstatnew ="log/supervise/stat.new";
    fpid ="log/supervise/pid";
    fpidnew ="log/supervise/pid.new";
  }

  /* pid */
  if (pidchanged) {
    if ((fd =open_trunc(fpidnew)) == -1) {
      warn2("unable to open ", fpidnew);
      return;
    }
    buffer_init(&b, buffer_unixwrite, fd, bspace, sizeof bspace);
    spid[fmt_ulong(spid, (unsigned long)s->pid)] =0;
    if (s->pid) {
      buffer_puts(&b, spid);
      buffer_puts(&b, "\n");
      buffer_flush(&b);
    }
    close(fd);
    if (rename(fpidnew, fpid) == -1) {
      warn2("unable to rename pid.new to ", fpid);
      return;
    }
    pidchanged =0;
  }

  /* stat */
  if ((fd =open_trunc(fstatnew)) == -1) {
    warn2("unable to open ", fstatnew);
    return;
  }
  buffer_init(&b, buffer_unixwrite, fd, bspace, sizeof bspace);
  switch (s->state) {
  case S_DOWN:
    buffer_puts(&b, "down");
    break;
  case S_RUN:
    buffer_puts(&b, "run");
    break;
  case S_FINISH:
    buffer_puts(&b, "finish");
    break;
  }
  if (s->ctrl & C_PAUSE) buffer_puts(&b, ", paused");
  if (s->ctrl & C_TERM) buffer_puts(&b, ", got TERM");
  if (s->state != S_DOWN)
    switch(s->want) {
    case W_DOWN:
      buffer_puts(&b, ", want down");
      break;
    case W_EXIT:
      buffer_puts(&b, ", want exit");
      break;
    }
  buffer_puts(&b, "\n");
  buffer_flush(&b);
  close(fd);
  if (rename(fstatnew, fstat) == -1)
    warn2("unable to rename stat.new to ", fstat);

  /* supervise compatibility */
  taia_pack(status, &s->start);
  l =(unsigned long)s->pid;
  status[12] =l; l >>=8;
  status[13] =l; l >>=8;
  status[14] =l; l >>=8;
  status[15] =l;
  if (s->ctrl & C_PAUSE)
    status[16] =1;
  else
    status[16] =0;
  if (s->want == W_UP)
    status[17] ='u';
  else
    status[17] ='d';
  if (s->ctrl & C_TERM)
    status[18] =1;
  else
    status[18] =0;
  status[19] =s->state;
  if ((fd =open_trunc(fstatusnew)) == -1) {
    warn2("unable to open ", fstatusnew);
    return;
  }
  if ((l =write(fd, status, sizeof status)) == -1) {
    warn2("unable to write ", fstatusnew);
    close(fd);
    unlink(fstatusnew);
    return;
  }
  close(fd);
  if (l < sizeof status) {
    warnx("unable to write ", fstatusnew, ": partial write.");
    return;
  }
  if (rename(fstatusnew, fstatus) == -1)
    warn2("unable to rename status.new to ", fstatus);
}